

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

void __thiscall
crnlib::
hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
::rehash(hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
         *this,uint new_hash_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  ulong uVar5;
  raw_node *prVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  raw_node *prVar11;
  raw_node *prVar12;
  hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>
  new_map;
  elemental_vector local_48;
  uint local_38;
  undefined8 local_30;
  
  if ((this->m_num_valid <= new_hash_size) &&
     (uVar5 = (ulong)new_hash_size, (this->m_values).m_size != new_hash_size)) {
    local_48.m_p = (raw_node *)0x0;
    local_48.m_size = 0;
    local_48.m_capacity = 0;
    local_38 = 0x20;
    local_30 = 0;
    if (new_hash_size != 0) {
      if (new_hash_size != 0) {
        elemental_vector::increase_capacity
                  (&local_48,new_hash_size,new_hash_size == 1,0x44,
                   vector<crnlib::hash_map<crnlib::block,_crnlib::empty_type,_crnlib::hasher<crnlib::block>,_crnlib::equal_to<crnlib::block>_>::raw_node>
                   ::object_mover,false);
      }
      if (new_hash_size - local_48.m_size != 0) {
        lVar8 = 0;
        do {
          ((raw_node *)((long)local_48.m_p + (local_48._8_8_ & 0xffffffff) * 0x44))->m_bits
          [lVar8 + 0x41] = '\0';
          lVar8 = lVar8 + 0x44;
        } while ((ulong)(new_hash_size - local_48.m_size) * 0x44 != lVar8);
      }
      local_48.m_size = new_hash_size;
    }
    local_38 = 0x20;
    if (1 < new_hash_size) {
      do {
        local_38 = local_38 - 1;
        uVar7 = (uint)uVar5;
        uVar5 = uVar5 >> 1;
      } while (3 < uVar7);
    }
    local_30._4_4_ = 0xffffffff;
    uVar5 = (ulong)(this->m_values).m_size;
    if (uVar5 != 0) {
      prVar11 = (this->m_values).m_p;
      prVar12 = prVar11 + uVar5;
      do {
        if (prVar11->m_bits[0x41] != '\0') {
          uVar4 = fast_hash(prVar11,0x40);
          uVar7 = uVar4 * -0x61c88647 >> ((byte)local_38 & 0x1f);
          prVar6 = (raw_node *)((long)local_48.m_p + (ulong)uVar7 * 0x44);
          if (((raw_node *)((long)local_48.m_p + (ulong)uVar7 * 0x44))->m_bits[0x41] != '\0') {
            uVar10 = uVar7;
            do {
              uVar9 = uVar10 - 1;
              if (uVar10 == 0) {
                uVar9 = local_48.m_size - 1;
              }
              if (uVar9 == uVar7) goto LAB_0010bb4f;
              prVar6 = prVar6 + -1;
              if (uVar10 == 0) {
                prVar6 = (raw_node *)((long)local_48.m_p + (ulong)(local_48.m_size - 1) * 0x44);
              }
              uVar10 = uVar9;
            } while (prVar6->m_bits[0x41] != '\0');
          }
          lVar8 = 0;
          do {
            prVar6->m_bits[lVar8 * 4] = prVar11->m_bits[lVar8 * 4];
            prVar6->m_bits[lVar8 * 4 + 1] = prVar11->m_bits[lVar8 * 4 + 1];
            prVar6->m_bits[lVar8 * 4 + 2] = prVar11->m_bits[lVar8 * 4 + 2];
            prVar6->m_bits[lVar8 * 4 + 3] = prVar11->m_bits[lVar8 * 4 + 3];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
          prVar6->m_bits[0x40] = prVar11->m_bits[0x40];
          prVar6->m_bits[0x41] = '\x01';
          prVar11->m_bits[0x41] = '\0';
          local_30._0_4_ = (uint)local_30 + 1;
LAB_0010bb4f:
          if ((uint)local_30 == this->m_num_valid) break;
        }
        prVar11 = prVar11 + 1;
      } while (prVar11 != prVar12);
    }
    local_30._4_4_ = new_hash_size + 1 >> 1;
    prVar11 = (this->m_values).m_p;
    if (prVar11 != (raw_node *)0x0) {
      crnlib_free(prVar11);
      (this->m_values).m_p = (raw_node *)0x0;
      (this->m_values).m_size = 0;
      (this->m_values).m_capacity = 0;
    }
    this->m_hash_shift = 0x20;
    prVar11 = (this->m_values).m_p;
    (this->m_values).m_p = (raw_node *)local_48.m_p;
    uVar1 = (this->m_values).m_size;
    (this->m_values).m_size = local_48.m_size;
    uVar2 = (this->m_values).m_capacity;
    (this->m_values).m_capacity = local_48.m_capacity;
    local_48.m_capacity = uVar2;
    local_48.m_size = uVar1;
    this->m_hash_shift = local_38;
    local_38 = 0x20;
    uVar2 = this->m_num_valid;
    this->m_num_valid = (uint)local_30;
    uVar3 = this->m_grow_threshold;
    this->m_grow_threshold = local_30._4_4_;
    local_30 = CONCAT44(uVar3,uVar2);
    local_48.m_p = prVar11;
    if (uVar1 != 0) {
      if (prVar11 != (raw_node *)0x0) {
        crnlib_free(prVar11);
        local_48.m_p = (raw_node *)0x0;
        local_48.m_size = 0;
        local_48.m_capacity = 0;
      }
      local_30 = 0;
    }
    local_38 = 0x20;
    if ((raw_node *)local_48.m_p != (raw_node *)0x0) {
      crnlib_free(local_48.m_p);
    }
  }
  return;
}

Assistant:

inline void rehash(uint new_hash_size) {
    CRNLIB_ASSERT(new_hash_size >= m_num_valid);
    CRNLIB_ASSERT(math::is_power_of_2(new_hash_size));

    if ((new_hash_size < m_num_valid) || (new_hash_size == m_values.size()))
      return;

    hash_map new_map;
    new_map.m_values.resize(new_hash_size);
    new_map.m_hash_shift = 32U - math::floor_log2i(new_hash_size);
    CRNLIB_ASSERT(new_hash_size == (1U << (32U - new_map.m_hash_shift)));
    new_map.m_grow_threshold = UINT_MAX;

    node* pNode = reinterpret_cast<node*>(m_values.begin());
    node* pNode_end = pNode + m_values.size();

    while (pNode != pNode_end) {
      if (pNode->state) {
        new_map.move_into(pNode);

        if (new_map.m_num_valid == m_num_valid)
          break;
      }

      pNode++;
    }

    new_map.m_grow_threshold = (new_hash_size + 1U) >> 1U;

    m_values.clear_no_destruction();
    m_hash_shift = 32;

    swap(new_map);
  }